

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O0

void pztopology::TPZTriangle::ComputeHCurlDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions,
               TPZVec<int> *transformationIds)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  TPZVec<int> *in_RDX;
  TPZBaseMatrix *in_RDI;
  int i_1;
  int faceOrient;
  int iEdge;
  TPZManVector<double,_3> edgeSign;
  int facePermute;
  REAL edgeLength [3];
  REAL faceArea;
  int nFaces;
  int nEdges;
  int i;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  int64_t dim;
  Fad<double> *in_stack_fffffffffffff8f8;
  TPZManVector<double,_3> *in_stack_fffffffffffff900;
  Fad<double> *in_stack_fffffffffffff908;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffff910;
  Fad<double> *in_stack_fffffffffffff918;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff920;
  int64_t in_stack_fffffffffffff928;
  TPZManVector<double,_3> *in_stack_fffffffffffff930;
  Fad<double> *in_stack_fffffffffffff938;
  Fad<double> *in_stack_fffffffffffff940;
  Fad<double> *in_stack_fffffffffffff948;
  double in_stack_fffffffffffff950;
  Fad<double> *in_stack_fffffffffffff958;
  int64_t in_stack_fffffffffffff998;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffff9a0;
  int local_1ac;
  int local_1a4;
  TPZVec<double> local_198;
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined4 local_134;
  int local_130;
  TPZVec<Fad<double>_> local_120 [4];
  TPZVec<Fad<double>_> local_a0 [4];
  int64_t local_20;
  TPZVec<int> *local_18;
  
  local_18 = in_RDX;
  local_20 = TPZBaseMatrix::Rows(in_RDI);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  for (local_130 = 0; local_130 < local_20; local_130 = local_130 + 1) {
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_130);
    Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_130);
    Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  }
  local_134 = 3;
  local_138 = 1;
  local_140 = 0x3fe0000000000000;
  local_148 = 0x3ff0000000000000;
  local_158 = 0x3ff0000000000000;
  uStack_150 = 0x3ff6a09e667f3bcd;
  piVar2 = TPZVec<int>::operator[](local_18,3);
  local_15c = *piVar2;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffff930,in_stack_fffffffffffff928,(double *)in_stack_fffffffffffff920
            );
  for (local_1a4 = 0; local_1a4 < 3; local_1a4 = local_1a4 + 1) {
    piVar2 = TPZVec<int>::operator[](local_18,(long)local_1a4);
    iVar1 = *piVar2;
    pdVar3 = TPZVec<double>::operator[](&local_198,(long)local_1a4);
    *pdVar3 = (double)(int)(-(uint)(iVar1 != 0) | 1);
  }
  piVar2 = TPZVec<int>::operator[](local_18,3);
  iVar1 = -1;
  if (*piVar2 % 2 == 0) {
    iVar1 = 1;
  }
  for (local_1ac = 0; local_1ac < local_20; local_1ac = local_1ac + 1) {
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    TPZVec<double>::operator[](&local_198,0);
    operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff938,(Fad<double> *)in_stack_fffffffffffff930);
    TPZVec<double>::operator[](&local_198,0);
    operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZVec<double>::operator[](&local_198,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    Fad<double>::operator-(in_stack_fffffffffffff908);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    TPZVec<double>::operator[](&local_198,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)
               in_stack_fffffffffffff900);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x15c521d);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff938,(Fad<double> *)in_stack_fffffffffffff930);
    operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_int,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20));
    TPZVec<double>::operator[](&local_198,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    Fad<double>::operator-(in_stack_fffffffffffff908);
    TPZVec<double>::operator[](&local_198,2);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)
               in_stack_fffffffffffff900);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x15c545b);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator*<double,_Fad<double>,_nullptr>
              ((double)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    operator+<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_fffffffffffff938,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff930);
    TPZVec<double>::operator[](&local_198,0);
    operator*<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    Fad<double>::operator-(in_stack_fffffffffffff908);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator+<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff938,
               (Fad<double> *)in_stack_fffffffffffff930);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZVec<double>::operator[](&local_198,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_fffffffffffff900);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x15c5712);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    operator*<double,_Fad<double>,_nullptr>
              ((double)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator-<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff938,
               (Fad<double> *)in_stack_fffffffffffff930);
    TPZVec<double>::operator[](&local_198,2);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    TPZVec<double>::operator[](&local_198,0);
    TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    operator*<double,_Fad<double>,_nullptr>
              ((double)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
               (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    pdVar3 = TPZVec<double>::operator[](&local_198,1);
    in_stack_fffffffffffff950 = (double)iVar1 * *pdVar3;
    in_stack_fffffffffffff958 = TPZVec<Fad<double>_>::operator[](local_120,(long)local_1ac);
    Fad<double>::operator-(in_stack_fffffffffffff908);
    in_stack_fffffffffffff948 = TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    operator-<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff938,
               (Fad<double> *)in_stack_fffffffffffff930);
    operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_fffffffffffff948,
               (FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_fffffffffffff940);
    operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    in_stack_fffffffffffff940 =
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
                    (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_fffffffffffff900);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x15c5aa6);
    in_stack_fffffffffffff930 = (TPZManVector<double,_3> *)(double)iVar1;
    in_stack_fffffffffffff938 = (Fad<double> *)TPZVec<double>::operator[](&local_198,2);
    in_stack_fffffffffffff920 =
         (TPZFMatrix<Fad<double>_> *)
         ((double)in_stack_fffffffffffff930 * in_stack_fffffffffffff938->val_);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    operator*<double,_Fad<double>,_nullptr>
              ((double)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950);
    in_stack_fffffffffffff918 =
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
                    (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff920,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffff918);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff900);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 = (Fad<double> *)(fTangentVectors[local_15c * 2] + local_1ac);
    in_stack_fffffffffffff910 =
         (TPZManVector<Fad<double>,_3> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
                    (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffff910,&in_stack_fffffffffffff908->val_);
    in_stack_fffffffffffff900 =
         (TPZManVector<double,_3> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff920,(int64_t)in_stack_fffffffffffff918,
                    (int64_t)in_stack_fffffffffffff910);
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffff910,&in_stack_fffffffffffff908->val_);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff900);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffff910);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffff910);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }